

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhombicCode.cpp
# Opt level: O2

void __thiscall RhombicCode::buildSyndromeIndices(RhombicCode *this)

{
  set<int,_std::less<int>,_std::allocator<int>_> *this_00;
  Lattice *pLVar1;
  int iVar2;
  uint vertexIndex;
  int iVar3;
  int iVar4;
  double dVar5;
  cartesian4 cVar6;
  allocator local_5d;
  int local_5c;
  string local_58 [32];
  double local_38;
  
  this_00 = &(this->super_Code).syndromeIndices;
  vertexIndex = 0;
  do {
    local_38 = (double)(int)vertexIndex;
    dVar5 = pow((double)(this->super_Code).l,3.0);
    if (dVar5 <= local_38) {
      return;
    }
    cVar6 = Lattice::indexToCoordinate
                      ((this->super_Code).lattice._M_t.
                       super___uniq_ptr_impl<Lattice,_std::default_delete<Lattice>_>._M_t.
                       super__Tuple_impl<0UL,_Lattice_*,_std::default_delete<Lattice>_>.
                       super__Head_base<0UL,_Lattice_*,_false>._M_head_impl,vertexIndex);
    iVar2 = cVar6.z;
    if (cVar6._0_8_ >> 0x20 != 0 && iVar2 != 0) {
      iVar3 = (this->super_Code).l + -1;
      if ((iVar3 != cVar6.y) &&
         (iVar4 = cVar6.x, (cVar6.y + iVar2 + iVar4) % 2 == this->latticeParity)) {
        if (iVar2 == 1) {
          if (iVar4 != 0) {
            pLVar1 = (this->super_Code).lattice._M_t.
                     super___uniq_ptr_impl<Lattice,_std::default_delete<Lattice>_>._M_t.
                     super__Tuple_impl<0UL,_Lattice_*,_std::default_delete<Lattice>_>.
                     super__Head_base<0UL,_Lattice_*,_false>._M_head_impl;
            std::__cxx11::string::string(local_58,"yz",&local_5d);
            local_5c = (*pLVar1->_vptr_Lattice[2])(pLVar1,(ulong)vertexIndex,local_58,1);
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            _M_insert_unique<int>(&this_00->_M_t,&local_5c);
            std::__cxx11::string::~string(local_58);
            pLVar1 = (this->super_Code).lattice._M_t.
                     super___uniq_ptr_impl<Lattice,_std::default_delete<Lattice>_>._M_t.
                     super__Tuple_impl<0UL,_Lattice_*,_std::default_delete<Lattice>_>.
                     super__Head_base<0UL,_Lattice_*,_false>._M_head_impl;
            std::__cxx11::string::string(local_58,"xy",&local_5d);
            local_5c = (*pLVar1->_vptr_Lattice[2])
                                 (pLVar1,(ulong)vertexIndex,local_58,0xffffffffffffffff);
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            _M_insert_unique<int>(&this_00->_M_t,&local_5c);
            std::__cxx11::string::~string(local_58);
            iVar3 = (this->super_Code).l + -1;
          }
          if (iVar3 != iVar4) {
            pLVar1 = (this->super_Code).lattice._M_t.
                     super___uniq_ptr_impl<Lattice,_std::default_delete<Lattice>_>._M_t.
                     super__Tuple_impl<0UL,_Lattice_*,_std::default_delete<Lattice>_>.
                     super__Head_base<0UL,_Lattice_*,_false>._M_head_impl;
            std::__cxx11::string::string(local_58,"xyz",&local_5d);
            local_5c = (*pLVar1->_vptr_Lattice[2])(pLVar1,(ulong)vertexIndex,local_58,1);
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            _M_insert_unique<int>(&this_00->_M_t,&local_5c);
            std::__cxx11::string::~string(local_58);
            pLVar1 = (this->super_Code).lattice._M_t.
                     super___uniq_ptr_impl<Lattice,_std::default_delete<Lattice>_>._M_t.
                     super__Tuple_impl<0UL,_Lattice_*,_std::default_delete<Lattice>_>.
                     super__Head_base<0UL,_Lattice_*,_false>._M_head_impl;
            std::__cxx11::string::string(local_58,"xz",&local_5d);
            local_5c = (*pLVar1->_vptr_Lattice[2])(pLVar1,(ulong)vertexIndex,local_58,1);
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            _M_insert_unique<int>(&this_00->_M_t,&local_5c);
            goto LAB_00113d07;
          }
        }
        else if (iVar3 == iVar2) {
          if (iVar4 != 0) {
            pLVar1 = (this->super_Code).lattice._M_t.
                     super___uniq_ptr_impl<Lattice,_std::default_delete<Lattice>_>._M_t.
                     super__Tuple_impl<0UL,_Lattice_*,_std::default_delete<Lattice>_>.
                     super__Head_base<0UL,_Lattice_*,_false>._M_head_impl;
            std::__cxx11::string::string(local_58,"xyz",&local_5d);
            local_5c = (*pLVar1->_vptr_Lattice[2])
                                 (pLVar1,(ulong)vertexIndex,local_58,0xffffffffffffffff);
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            _M_insert_unique<int>(&this_00->_M_t,&local_5c);
            std::__cxx11::string::~string(local_58);
            pLVar1 = (this->super_Code).lattice._M_t.
                     super___uniq_ptr_impl<Lattice,_std::default_delete<Lattice>_>._M_t.
                     super__Tuple_impl<0UL,_Lattice_*,_std::default_delete<Lattice>_>.
                     super__Head_base<0UL,_Lattice_*,_false>._M_head_impl;
            std::__cxx11::string::string(local_58,"xz",&local_5d);
            local_5c = (*pLVar1->_vptr_Lattice[2])
                                 (pLVar1,(ulong)vertexIndex,local_58,0xffffffffffffffff);
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            _M_insert_unique<int>(&this_00->_M_t,&local_5c);
            std::__cxx11::string::~string(local_58);
            iVar3 = (this->super_Code).l + -1;
          }
          if (iVar3 != iVar4) {
            pLVar1 = (this->super_Code).lattice._M_t.
                     super___uniq_ptr_impl<Lattice,_std::default_delete<Lattice>_>._M_t.
                     super__Tuple_impl<0UL,_Lattice_*,_std::default_delete<Lattice>_>.
                     super__Head_base<0UL,_Lattice_*,_false>._M_head_impl;
            std::__cxx11::string::string(local_58,"yz",&local_5d);
            local_5c = (*pLVar1->_vptr_Lattice[2])
                                 (pLVar1,(ulong)vertexIndex,local_58,0xffffffffffffffff);
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            _M_insert_unique<int>(&this_00->_M_t,&local_5c);
            std::__cxx11::string::~string(local_58);
            pLVar1 = (this->super_Code).lattice._M_t.
                     super___uniq_ptr_impl<Lattice,_std::default_delete<Lattice>_>._M_t.
                     super__Tuple_impl<0UL,_Lattice_*,_std::default_delete<Lattice>_>.
                     super__Head_base<0UL,_Lattice_*,_false>._M_head_impl;
            std::__cxx11::string::string(local_58,"xy",&local_5d);
            local_5c = (*pLVar1->_vptr_Lattice[2])(pLVar1,(ulong)vertexIndex,local_58,1);
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            _M_insert_unique<int>(&this_00->_M_t,&local_5c);
LAB_00113d07:
            std::__cxx11::string::~string(local_58);
          }
        }
        else {
          if (iVar4 != 0) {
            pLVar1 = (this->super_Code).lattice._M_t.
                     super___uniq_ptr_impl<Lattice,_std::default_delete<Lattice>_>._M_t.
                     super__Tuple_impl<0UL,_Lattice_*,_std::default_delete<Lattice>_>.
                     super__Head_base<0UL,_Lattice_*,_false>._M_head_impl;
            std::__cxx11::string::string(local_58,"xyz",&local_5d);
            local_5c = (*pLVar1->_vptr_Lattice[2])
                                 (pLVar1,(ulong)vertexIndex,local_58,0xffffffffffffffff);
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            _M_insert_unique<int>(&this_00->_M_t,&local_5c);
            std::__cxx11::string::~string(local_58);
            pLVar1 = (this->super_Code).lattice._M_t.
                     super___uniq_ptr_impl<Lattice,_std::default_delete<Lattice>_>._M_t.
                     super__Tuple_impl<0UL,_Lattice_*,_std::default_delete<Lattice>_>.
                     super__Head_base<0UL,_Lattice_*,_false>._M_head_impl;
            std::__cxx11::string::string(local_58,"xy",&local_5d);
            local_5c = (*pLVar1->_vptr_Lattice[2])
                                 (pLVar1,(ulong)vertexIndex,local_58,0xffffffffffffffff);
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            _M_insert_unique<int>(&this_00->_M_t,&local_5c);
            std::__cxx11::string::~string(local_58);
            pLVar1 = (this->super_Code).lattice._M_t.
                     super___uniq_ptr_impl<Lattice,_std::default_delete<Lattice>_>._M_t.
                     super__Tuple_impl<0UL,_Lattice_*,_std::default_delete<Lattice>_>.
                     super__Head_base<0UL,_Lattice_*,_false>._M_head_impl;
            std::__cxx11::string::string(local_58,"xz",&local_5d);
            local_5c = (*pLVar1->_vptr_Lattice[2])
                                 (pLVar1,(ulong)vertexIndex,local_58,0xffffffffffffffff);
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            _M_insert_unique<int>(&this_00->_M_t,&local_5c);
            std::__cxx11::string::~string(local_58);
            pLVar1 = (this->super_Code).lattice._M_t.
                     super___uniq_ptr_impl<Lattice,_std::default_delete<Lattice>_>._M_t.
                     super__Tuple_impl<0UL,_Lattice_*,_std::default_delete<Lattice>_>.
                     super__Head_base<0UL,_Lattice_*,_false>._M_head_impl;
            std::__cxx11::string::string(local_58,"yz",&local_5d);
            local_5c = (*pLVar1->_vptr_Lattice[2])(pLVar1,(ulong)vertexIndex,local_58,1);
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            _M_insert_unique<int>(&this_00->_M_t,&local_5c);
            std::__cxx11::string::~string(local_58);
            iVar3 = (this->super_Code).l + -1;
          }
          if (iVar3 != iVar4) {
            pLVar1 = (this->super_Code).lattice._M_t.
                     super___uniq_ptr_impl<Lattice,_std::default_delete<Lattice>_>._M_t.
                     super__Tuple_impl<0UL,_Lattice_*,_std::default_delete<Lattice>_>.
                     super__Head_base<0UL,_Lattice_*,_false>._M_head_impl;
            std::__cxx11::string::string(local_58,"xyz",&local_5d);
            local_5c = (*pLVar1->_vptr_Lattice[2])(pLVar1,(ulong)vertexIndex,local_58,1);
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            _M_insert_unique<int>(&this_00->_M_t,&local_5c);
            std::__cxx11::string::~string(local_58);
            pLVar1 = (this->super_Code).lattice._M_t.
                     super___uniq_ptr_impl<Lattice,_std::default_delete<Lattice>_>._M_t.
                     super__Tuple_impl<0UL,_Lattice_*,_std::default_delete<Lattice>_>.
                     super__Head_base<0UL,_Lattice_*,_false>._M_head_impl;
            std::__cxx11::string::string(local_58,"xy",&local_5d);
            local_5c = (*pLVar1->_vptr_Lattice[2])(pLVar1,(ulong)vertexIndex,local_58,1);
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            _M_insert_unique<int>(&this_00->_M_t,&local_5c);
            std::__cxx11::string::~string(local_58);
            pLVar1 = (this->super_Code).lattice._M_t.
                     super___uniq_ptr_impl<Lattice,_std::default_delete<Lattice>_>._M_t.
                     super__Tuple_impl<0UL,_Lattice_*,_std::default_delete<Lattice>_>.
                     super__Head_base<0UL,_Lattice_*,_false>._M_head_impl;
            std::__cxx11::string::string(local_58,"xz",&local_5d);
            local_5c = (*pLVar1->_vptr_Lattice[2])(pLVar1,(ulong)vertexIndex,local_58,1);
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            _M_insert_unique<int>(&this_00->_M_t,&local_5c);
            std::__cxx11::string::~string(local_58);
            pLVar1 = (this->super_Code).lattice._M_t.
                     super___uniq_ptr_impl<Lattice,_std::default_delete<Lattice>_>._M_t.
                     super__Tuple_impl<0UL,_Lattice_*,_std::default_delete<Lattice>_>.
                     super__Head_base<0UL,_Lattice_*,_false>._M_head_impl;
            std::__cxx11::string::string(local_58,"yz",&local_5d);
            local_5c = (*pLVar1->_vptr_Lattice[2])
                                 (pLVar1,(ulong)vertexIndex,local_58,0xffffffffffffffff);
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            _M_insert_unique<int>(&this_00->_M_t,&local_5c);
            goto LAB_00113d07;
          }
        }
      }
    }
    vertexIndex = vertexIndex + 1;
  } while( true );
}

Assistant:

void RhombicCode::buildSyndromeIndices()
{
    for (int i = 0; i < pow(l, 3); ++i)
    {
        const cartesian4 coordinate = lattice->indexToCoordinate(i);
        if (coordinate.z == 0 || coordinate.y == 0 || coordinate.y == l - 1)
        {
            continue;
        }
        else
        {
            if ((coordinate.x + coordinate.y + coordinate.z) % 2 == latticeParity)
            {
                if (coordinate.z == 1)
                {
                    if (coordinate.x != 0)
                    {
                        syndromeIndices.insert(lattice->edgeIndex(i, "yz", 1));
                        syndromeIndices.insert(lattice->edgeIndex(i, "xy", -1));
                    }
                    if (coordinate.x != l - 1)
                    {
                        syndromeIndices.insert(lattice->edgeIndex(i, "xyz", 1));
                        syndromeIndices.insert(lattice->edgeIndex(i, "xz", 1));
                    }
                }
                else if (coordinate.z == l - 1)
                {
                    if (coordinate.x != 0)
                    {
                        syndromeIndices.insert(lattice->edgeIndex(i, "xyz", -1));
                        syndromeIndices.insert(lattice->edgeIndex(i, "xz", -1));
                    }
                    if (coordinate.x != l - 1)
                    {
                        syndromeIndices.insert(lattice->edgeIndex(i, "yz", -1));
                        syndromeIndices.insert(lattice->edgeIndex(i, "xy", 1));
                    }
                }
                else
                {
                    if (coordinate.x != 0)
                    {
                        syndromeIndices.insert(lattice->edgeIndex(i, "xyz", -1));
                        syndromeIndices.insert(lattice->edgeIndex(i, "xy", -1));
                        syndromeIndices.insert(lattice->edgeIndex(i, "xz", -1));
                        syndromeIndices.insert(lattice->edgeIndex(i, "yz", 1));
                    }
                    if (coordinate.x != l - 1)
                    {
                        syndromeIndices.insert(lattice->edgeIndex(i, "xyz", 1));
                        syndromeIndices.insert(lattice->edgeIndex(i, "xy", 1));
                        syndromeIndices.insert(lattice->edgeIndex(i, "xz", 1));
                        syndromeIndices.insert(lattice->edgeIndex(i, "yz", -1));
                    }
                }
            }
        }
    }
}